

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3229:36)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3229:36)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  undefined8 *puVar3;
  pointer *ppcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  size_type __dnew;
  Optional<unsigned_int> parsedCount;
  _Alloc_hider local_c8;
  pointer local_c0;
  pointer local_b8;
  undefined8 uStack_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  uint *local_38 [2];
  
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_assign((string *)&local_a8);
  local_60 = 0;
  local_68 = &PTR__BasicResult_001b2540;
  local_50 = 0;
  local_48 = 0;
  local_58 = &local_48;
  parseUInt((Catch *)local_38,&local_a8,10);
  if (local_38[0] == (uint *)0x0) {
    std::operator+(&local_88,"Could not parse \'",&local_a8);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
    ppcVar4 = (pointer *)(puVar3 + 2);
    if ((pointer *)*puVar3 == ppcVar4) {
      local_b8 = *ppcVar4;
      uStack_b0 = puVar3[3];
      local_c8._M_p = (pointer)&local_b8;
    }
    else {
      local_b8 = *ppcVar4;
      local_c8._M_p = (pointer)*puVar3;
    }
    sVar2 = puVar3[1];
    *puVar3 = ppcVar4;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = RuntimeError;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
    paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
    if ((pointer *)local_c8._M_p == &local_b8) {
      paVar1->_M_allocated_capacity = (size_type)local_b8;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_b0;
    }
    else {
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_c8._M_p;
      (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = (size_type)local_b8;
    }
    (__return_storage_ptr__->m_errorMessage)._M_string_length = sVar2;
    local_c0 = (pointer)0x0;
    local_b8 = (pointer)((ulong)local_b8 & 0xffffffffffffff00);
    local_c8._M_p = (pointer)&local_b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else if (*local_38[0] == 0) {
    local_88._M_dataplus._M_p = (pointer)0x1c;
    local_c8._M_p = (pointer)&local_b8;
    local_c8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_88);
    local_b8 = local_88._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_c8._M_p + 0xc),"must be ",8);
    builtin_strncpy((char *)((long)local_c8._M_p + 0x14),"positive",8);
    *(undefined8 *)local_c8._M_p = 0x6f63206472616853;
    *(undefined8 *)((long)local_c8._M_p + 8) = 0x7473756d20746e75;
    local_c0 = local_88._M_dataplus._M_p;
    *(char *)((long)local_c8._M_p + (long)local_88._M_dataplus._M_p) = '\0';
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = RuntimeError;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
    paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
    if ((pointer *)local_c8._M_p == &local_b8) {
      paVar1->_M_allocated_capacity = (size_type)local_88._M_dataplus._M_p;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_b0;
    }
    else {
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_c8._M_p;
      (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
           (size_type)local_88._M_dataplus._M_p;
    }
    (__return_storage_ptr__->m_errorMessage)._M_string_length = (size_type)local_88._M_dataplus._M_p
    ;
  }
  else {
    ((this->m_lambda).config)->shardCount = *local_38[0];
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  local_68 = &PTR__BasicResult_001b2540;
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }